

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  uint compressed_length;
  istream *__n;
  void *pvVar4;
  ulong uVar5;
  size_type __n_00;
  ulong in_RCX;
  long lVar6;
  int iVar7;
  char *pcVar8;
  path *this;
  ulong uVar9;
  size_type __rlen;
  size_t module_size;
  ulong uVar10;
  DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> input_wrapped;
  path in_filename;
  path out_filename;
  ofstream out_file;
  char *end;
  string_view arg;
  DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  local_25d8;
  int local_25cc;
  ulong local_25c8;
  long local_25c0;
  char **local_25b8;
  ulong local_25b0;
  ulong local_25a8;
  ulong local_25a0;
  path local_2598;
  path local_2570;
  long local_2548;
  filebuf local_2540 [20];
  undefined4 auStack_252c [55];
  ios_base local_2450 [264];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2348;
  undefined4 auStack_232c [123];
  undefined1 local_2140 [8];
  char *local_2138 [2];
  undefined4 auStack_2124 [251];
  uint local_1d38;
  uint local_1cf8;
  uint local_1914;
  uint local_1838;
  uint local_1124;
  uint local_118;
  uint local_38;
  
  std::filesystem::__cxx11::path::path(&local_2598);
  std::filesystem::__cxx11::path::path(&local_2570);
  if (argc < 2) {
    uVar10 = 0;
    lVar6 = 0;
    uVar5 = 0;
    module_size = 0x1000;
    iVar3 = 0;
  }
  else {
    local_25a0 = (ulong)(argc - 1);
    local_25c8 = 0x1000;
    uVar9 = 0;
    local_25cc = 0;
    uVar10 = 0;
    local_25a8 = 0;
    local_25c0 = 0;
    local_25b8 = argv;
    do {
      pcVar8 = argv[uVar9 + 1];
      __n = (istream *)strlen(pcVar8);
      local_2140 = (undefined1  [8])__n;
      local_2138[0] = pcVar8;
      if (*pcVar8 == '-') {
        if (__n == (istream *)0x6) {
          iVar3 = bcmp(pcVar8,"--help",6);
joined_r0x00102b89:
          if (iVar3 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "Clownacy\'s LZSS compression tool\n\nUsage: clownlzss [options] [in-filename] [out-filename]\nOptions:\n\n Format:\n  -ch    Chameleon\n  -c     Comper\n  -e     Enigma\n  -f     Faxman\n  -g     GBA BIOS\n  -gv    GBA BIOS (VRAM safe)\n  -k     Kosinski\n  -kp    Kosinski+\n  -ra    Rage\n  -r     Rocket\n  -s     Saxman\n  -sn    Saxman (with no header)\n\n Misc:\n  -m[=MODULE_SIZE]  Compresses into modules\n                    MODULE_SIZE controls the module size (defaults to 0x1000)\n  -d     Decompress\n"
                       ,0x1ea);
            goto LAB_00102d07;
          }
        }
        else if (__n == (istream *)0x2) {
          iVar3 = bcmp(pcVar8,"-h",2);
          goto joined_r0x00102b89;
        }
        if (pcVar8[1] == 'm') {
          if (__n == (istream *)0x0) {
            uVar5 = 0xffffffffffffffff;
          }
          else {
            pvVar4 = memchr(pcVar8,0x3d,(size_t)__n);
            in_RCX = (long)pvVar4 - (long)pcVar8;
            uVar5 = -(ulong)(pvVar4 == (void *)0x0) | in_RCX;
          }
          in_RCX = CONCAT71((int7)(in_RCX >> 8),1);
          local_25a8 = in_RCX;
          if (uVar5 == 0xffffffffffffffff) goto LAB_00102d07;
          uVar5 = strtoul(pcVar8 + uVar5 + 1,(char **)&local_2348,0);
          bVar2 = *local_2348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start != '\0';
          if (*local_2348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start == '\0') {
            if (0x1000 < uVar5) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Warning: the moduled format header does not fully support sizes greater than\n 0x1000 - header will likely be invalid!\n"
                         ,0x76);
            }
          }
          else {
            local_25cc = 1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Invalid parameter to -m\n",0x18);
            uVar5 = local_25c8;
          }
        }
        else {
          if ((__n == (istream *)0x2) && (iVar3 = bcmp(pcVar8,"-d",2), iVar3 == 0)) {
            uVar10 = CONCAT71((int7)(uVar10 >> 8),1);
            goto LAB_00102d07;
          }
          lVar6 = 0;
          local_25b0 = uVar10;
          do {
            if ((__n == *(istream **)((long)&modes._M_elems[0].command._M_string_length + lVar6)) &&
               ((lVar1 = (long)&modes._M_elems[0].command._M_dataplus._M_p + lVar6,
                __n == (istream *)0x0 ||
                (iVar3 = bcmp(pcVar8,*(void **)((long)&modes._M_elems[0].command._M_dataplus._M_p +
                                               lVar6),(size_t)__n), iVar3 == 0)))) break;
            lVar6 = lVar6 + 0x68;
            lVar1 = local_25c0;
          } while (lVar6 != 0x4e0);
          local_25c0 = lVar1;
          bVar2 = false;
          argv = local_25b8;
          uVar10 = local_25b0;
          uVar5 = local_25c8;
        }
      }
      else {
        this = &local_2570;
        if (local_2598._M_pathname._M_string_length == 0) {
          this = &local_2598;
        }
        std::filesystem::__cxx11::path::operator=
                  (this,(basic_string_view<char,_std::char_traits<char>_> *)local_2140);
LAB_00102d07:
        bVar2 = false;
        uVar5 = local_25c8;
      }
      local_25c8 = uVar5;
      lVar6 = local_25c0;
      uVar5 = local_25a8;
      module_size = local_25c8;
      iVar3 = local_25cc;
    } while ((!bVar2) && (uVar9 = uVar9 + 1, uVar9 != local_25a0));
  }
  iVar7 = 1;
  if (iVar3 != 1) {
    if (local_2598._M_pathname._M_string_length == 0) {
      lVar6 = 0x20;
      pcVar8 = "Error: Input file not specified\n";
    }
    else {
      if (lVar6 != 0) {
        if (local_2570._M_pathname._M_string_length == 0) {
          std::filesystem::__cxx11::path::operator=
                    (&local_2570,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((ulong)(((uint)uVar5 & 1) << 5) + lVar6 + 0x28));
        }
        std::ofstream::ofstream(&local_2548);
        lVar1 = *(long *)(local_2548 + -0x18);
        *(undefined4 *)((long)auStack_252c + lVar1) = 7;
        std::ios::clear((int)&local_25d8 + (int)lVar1 + 0x90);
        std::ofstream::open((char *)&local_2548,
                            (_Ios_Openmode)local_2570._M_pathname._M_dataplus._M_p);
        if ((uVar10 & 1) == 0) {
          __n_00 = std::filesystem::file_size(&local_2598);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&local_2348,__n_00,(allocator_type *)local_2140);
          std::ifstream::ifstream(local_2140);
          lVar1 = *(long *)((long)local_2140 + -0x18);
          *(undefined4 *)((long)auStack_2124 + lVar1) = 7;
          std::ios::clear((int)&local_25d8 + (int)lVar1 + 0x498);
          std::ifstream::open(local_2140,(_Ios_Openmode)local_2598._M_pathname._M_dataplus._M_p);
          std::istream::read(local_2140,
                             (long)local_2348.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
          std::ifstream::~ifstream(local_2140);
          switch(*(undefined4 *)(lVar6 + 0x20)) {
          case 0:
            local_2140 = (undefined1  [8])&local_2548;
            if ((uVar5 & 1) == 0) {
              bVar2 = ClownLZSS::Internal::Chameleon::Compress<std::ofstream>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140);
            }
            else {
              bVar2 = ClownLZSS::Internal::
                      ModuledCompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ofstream>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140,
                                 ClownLZSS::Internal::Chameleon::Compress<std::ofstream>,module_size
                                 ,2);
            }
            break;
          case 1:
            local_2140 = (undefined1  [8])&local_2548;
            if ((uVar5 & 1) == 0) {
              bVar2 = ClownLZSS::Internal::Comper::Compress<std::ofstream>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140);
            }
            else {
              bVar2 = ClownLZSS::Internal::
                      ModuledCompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ofstream>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140,ClownLZSS::Internal::Comper::Compress<std::ofstream>,
                                 module_size,2);
            }
            break;
          case 2:
            if ((uVar5 & 1) == 0) {
              bVar2 = ClownLZSS::EnigmaCompress<std::ofstream&>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (basic_ofstream<char,_std::char_traits<char>_> *)&local_2548);
            }
            else {
              local_2140 = (undefined1  [8])&local_2548;
              bVar2 = ClownLZSS::Internal::
                      ModuledCompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ofstream>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140,ClownLZSS::Internal::Enigma::Compress<std::ofstream>,
                                 module_size,2);
            }
            break;
          case 3:
            local_2140 = (undefined1  [8])&local_2548;
            if ((uVar5 & 1) == 0) {
              bVar2 = ClownLZSS::Internal::Faxman::Compress<std::ofstream>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140);
            }
            else {
              bVar2 = ClownLZSS::Internal::
                      ModuledCompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ofstream>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140,ClownLZSS::Internal::Faxman::Compress<std::ofstream>,
                                 module_size,2);
            }
            break;
          case 4:
            if ((uVar5 & 1) == 0) {
              local_2140 = (undefined1  [8])&local_2548;
              bVar2 = ClownLZSS::Internal::Gba::
                      Compress<std::ofstream,unsigned_long(*)(unsigned_long,unsigned_long,void*)>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 ClownLZSS::Internal::Gba::GetMatchCost,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140);
            }
            else {
              local_2140 = (undefined1  [8])&local_2548;
              bVar2 = ClownLZSS::Internal::
                      ModuledCompressionWrapper<4u,(ClownLZSS::Internal::Endian)1,std::ofstream>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140,ClownLZSS::Internal::Gba::Compress<std::ofstream>,
                                 module_size,4);
            }
            break;
          case 5:
            if ((uVar5 & 1) == 0) {
              local_2140 = (undefined1  [8])&local_2548;
              bVar2 = ClownLZSS::Internal::Gba::
                      Compress<std::ofstream,unsigned_long(*)(unsigned_long,unsigned_long,void*)>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 ClownLZSS::Internal::Gba::GetMatchCostVramSafe,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140);
            }
            else {
              local_2140 = (undefined1  [8])&local_2548;
              bVar2 = ClownLZSS::Internal::
                      ModuledCompressionWrapper<4u,(ClownLZSS::Internal::Endian)1,std::ofstream>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140,
                                 ClownLZSS::Internal::Gba::CompressVramSafe<std::ofstream>,
                                 module_size,4);
            }
            break;
          case 6:
            local_2140 = (undefined1  [8])&local_2548;
            if ((uVar5 & 1) == 0) {
              bVar2 = ClownLZSS::Internal::Kosinski::Compress<std::ofstream>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140);
            }
            else {
              bVar2 = ClownLZSS::Internal::
                      ModuledCompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ofstream>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140,
                                 ClownLZSS::Internal::Kosinski::Compress<std::ofstream>,module_size,
                                 0x10);
            }
            break;
          case 7:
            local_2140 = (undefined1  [8])&local_2548;
            if ((uVar5 & 1) == 0) {
              bVar2 = ClownLZSS::Internal::KosinskiPlus::Compress<std::ofstream>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140);
            }
            else {
              bVar2 = ClownLZSS::Internal::
                      ModuledCompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ofstream>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140,
                                 ClownLZSS::Internal::KosinskiPlus::Compress<std::ofstream>,
                                 module_size,1);
            }
            break;
          case 8:
            local_2140 = (undefined1  [8])&local_2548;
            if ((uVar5 & 1) == 0) {
              bVar2 = ClownLZSS::Internal::Rage::Compress<std::ofstream>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140);
            }
            else {
              bVar2 = ClownLZSS::Internal::
                      ModuledCompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ofstream>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140,ClownLZSS::Internal::Rage::Compress<std::ofstream>,
                                 module_size,2);
            }
            break;
          case 9:
            local_2140 = (undefined1  [8])&local_2548;
            if ((uVar5 & 1) == 0) {
              bVar2 = ClownLZSS::Internal::Rocket::Compress<std::ofstream>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140);
            }
            else {
              bVar2 = ClownLZSS::Internal::
                      ModuledCompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ofstream>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140,ClownLZSS::Internal::Rocket::Compress<std::ofstream>,
                                 module_size,2);
            }
            break;
          case 10:
            local_2140 = (undefined1  [8])&local_2548;
            if ((uVar5 & 1) == 0) {
              bVar2 = ClownLZSS::Internal::Saxman::
                      CompressWithHeader<ClownLZSS::CompressorOutput<std::ofstream>&>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140);
            }
            else {
              bVar2 = ClownLZSS::Internal::
                      ModuledCompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ofstream>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140,
                                 ClownLZSS::Internal::Saxman::
                                 CompressWithHeader<ClownLZSS::CompressorOutput<std::ofstream>&>,
                                 module_size,2);
            }
            break;
          case 0xb:
            local_2140 = (undefined1  [8])&local_2548;
            if ((uVar5 & 1) == 0) {
              bVar2 = ClownLZSS::Internal::Saxman::Compress<std::ofstream>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140);
            }
            else {
              bVar2 = ClownLZSS::Internal::
                      ModuledCompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ofstream>
                                (local_2348.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_2348.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                 (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>
                                  *)local_2140,
                                 ClownLZSS::Internal::Saxman::
                                 CompressWithHeader<ClownLZSS::CompressorOutput<std::ofstream>&>,
                                 module_size,2);
            }
            break;
          default:
            bVar2 = false;
          }
          if (local_2348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (uchar *)0x0) {
            operator_delete(local_2348.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_2348.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2348.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (bVar2 == false) {
            iVar3 = 1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error: File could not be compressed\n",0x24);
          }
        }
        else {
          std::ifstream::ifstream(&local_2348);
          lVar1 = *(long *)(local_2348.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + -0x18);
          *(undefined4 *)((long)auStack_232c + lVar1) = 7;
          std::ios::clear((int)&local_25d8 + (int)lVar1 + 0x290);
          std::ifstream::open((char *)&local_2348,
                              (_Ios_Openmode)local_2598._M_pathname._M_dataplus._M_p);
          switch(*(undefined4 *)(lVar6 + 0x20)) {
          case 0:
            if ((uVar5 & 1) == 0) {
              local_2140 = (undefined1  [8])&local_2548;
              local_1838 = 0;
              local_25d8.input = (istream *)&local_2348;
              ClownLZSS::Internal::Chameleon::Decompress<std::ifstream,std::ofstream&>
                        ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_25d8,(DecompressorOutput<std::basic_ofstream<char>_&> *)local_2140);
            }
            else {
              local_2140 = (undefined1  [8])&local_2548;
              local_1838 = 0;
              local_25d8.input = (istream *)&local_2348;
              ClownLZSS::Internal::
              ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,2047u,255u,_1>>
                        ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_25d8,
                         (DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2047U,_255U,__1>
                          *)local_2140,
                         ClownLZSS::Internal::Chameleon::Decompress<std::ifstream,std::ofstream&>,2)
              ;
            }
            break;
          case 1:
            if ((uVar5 & 1) == 0) {
              local_2140 = (undefined1  [8])&local_2548;
              local_1d38 = 0;
              local_25d8.input = (istream *)&local_2348;
              ClownLZSS::Internal::Comper::Decompress<std::ifstream,std::ofstream&>
                        ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_25d8,(DecompressorOutput<std::basic_ofstream<char>_&> *)local_2140);
            }
            else {
              local_2140 = (undefined1  [8])&local_2548;
              local_1d38 = 0;
              local_25d8.input = (istream *)&local_2348;
              ClownLZSS::Internal::
              ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,512u,512u,_1>>
                        ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_25d8,
                         (DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_512U,_512U,__1>
                          *)local_2140,
                         ClownLZSS::Internal::Comper::Decompress<std::ifstream,std::ofstream&>,2);
            }
            break;
          case 2:
            local_2140 = (undefined1  [8])&local_2348;
            if ((uVar5 & 1) == 0) {
              local_25d8.input = (istream *)&local_2548;
              ClownLZSS::Internal::Enigma::Decompress<std::ifstream,std::ofstream&>
                        ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         local_2140,(DecompressorOutput<std::basic_ofstream<char>_&> *)&local_25d8);
            }
            else {
              local_25d8.input = (istream *)&local_2548;
              ClownLZSS::Internal::
              ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOuputBasic<std::ofstream&>>
                        ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         local_2140,
                         (DecompressorOuputBasic<std::basic_ofstream<char,_std::char_traits<char>_>_&>
                          *)&local_25d8,
                         ClownLZSS::Internal::Enigma::Decompress<std::ifstream,std::ofstream&>,2);
            }
            break;
          case 3:
            if ((uVar5 & 1) == 0) {
              local_2140 = (undefined1  [8])&local_2548;
              local_1914 = 0;
              local_25d8.input = (istream *)&local_2348;
              ClownLZSS::Internal::Faxman::Decompress<std::ifstream,std::ofstream&>
                        ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_25d8,(DecompressorOutput<std::basic_ofstream<char>_&> *)local_2140);
            }
            else {
              local_2140 = (undefined1  [8])&local_2548;
              local_1914 = 0;
              local_25d8.input = (istream *)&local_2348;
              ClownLZSS::Internal::
              ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,2048u,34u,_1>>
                        ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_25d8,
                         (DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_2048U,_34U,__1>
                          *)local_2140,
                         ClownLZSS::Internal::Faxman::Decompress<std::ifstream,std::ofstream&>,2);
            }
            break;
          case 4:
          case 5:
            if ((uVar5 & 1) == 0) {
              ClownLZSS::GbaDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&local_2348,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_2548);
            }
            else {
              local_2140 = (undefined1  [8])&local_2548;
              local_1124 = 0;
              local_25d8.input = (istream *)&local_2348;
              ClownLZSS::Internal::
              ModuledDecompressionWrapper<4u,(ClownLZSS::Internal::Endian)1,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,4096u,18u,_1>>
                        ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_25d8,
                         (DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,__1>
                          *)local_2140,
                         ClownLZSS::Internal::Gba::Decompress<std::ifstream,std::ofstream&>,4);
            }
            break;
          case 6:
            if ((uVar5 & 1) == 0) {
              local_2140 = (undefined1  [8])&local_2548;
              local_38 = 0;
              local_25d8.input = (istream *)&local_2348;
              ClownLZSS::Internal::Kosinski::Decompress<std::ifstream,std::ofstream&>
                        ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_25d8,(DecompressorOutput<std::basic_ofstream<char>_&> *)local_2140);
            }
            else {
              local_2140 = (undefined1  [8])&local_2548;
              local_38 = 0;
              local_25d8.input = (istream *)&local_2348;
              ClownLZSS::Internal::
              ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,8192u,256u,_1>>
                        ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_25d8,
                         (DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_8192U,_256U,__1>
                          *)local_2140,
                         ClownLZSS::Internal::Kosinski::Decompress<std::ifstream,std::ofstream&>,
                         0x10);
            }
            break;
          case 7:
            if ((uVar5 & 1) == 0) {
              local_2140 = (undefined1  [8])&local_2548;
              local_38 = 0;
              local_25d8.input = (istream *)&local_2348;
              ClownLZSS::Internal::KosinskiPlus::Decompress<std::ifstream,std::ofstream&>
                        ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_25d8,(DecompressorOutput<std::basic_ofstream<char>_&> *)local_2140);
            }
            else {
              local_2140 = (undefined1  [8])&local_2548;
              local_38 = 0;
              local_25d8.input = (istream *)&local_2348;
              ClownLZSS::Internal::
              ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,8192u,256u,_1>>
                        ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_25d8,
                         (DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_8192U,_256U,__1>
                          *)local_2140,
                         ClownLZSS::Internal::KosinskiPlus::Decompress<std::ifstream,std::ofstream&>
                         ,1);
            }
            break;
          case 8:
            if ((uVar5 & 1) == 0) {
              local_2140 = (undefined1  [8])&local_2548;
              local_118 = 0;
              local_25d8.input = (istream *)&local_2348;
              ClownLZSS::Internal::Rage::Decompress<std::ifstream,std::ofstream&>
                        ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_25d8,(DecompressorOutput<std::basic_ofstream<char>_&> *)local_2140);
            }
            else {
              local_2140 = (undefined1  [8])&local_2548;
              local_118 = 0;
              local_25d8.input = (istream *)&local_2348;
              ClownLZSS::Internal::
              ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,8191u,31u,_1>>
                        ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_25d8,
                         (DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_8191U,_31U,__1>
                          *)local_2140,
                         ClownLZSS::Internal::Rage::Decompress<std::ifstream,std::ofstream&>,2);
            }
            break;
          case 9:
            if ((uVar5 & 1) == 0) {
              local_25d8.input = (istream *)&local_2348;
              memset(local_2138,0x20,0x43f);
              local_2140 = (undefined1  [8])&local_2548;
              local_1cf8 = 0;
              ClownLZSS::Internal::Rocket::Decompress<std::ifstream,std::ofstream&>
                        ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_25d8,(DecompressorOutput<std::basic_ofstream<char>_&> *)local_2140);
            }
            else {
              local_25d8.input = (istream *)&local_2348;
              memset(local_2138,0x20,0x43f);
              local_2140 = (undefined1  [8])&local_2548;
              local_1cf8 = 0;
              ClownLZSS::Internal::
              ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,1024u,64u,32>>
                        ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_25d8,
                         (DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_1024U,_64U,_32>
                          *)local_2140,
                         ClownLZSS::Internal::Rocket::Decompress<std::ifstream,std::ofstream&>,2);
            }
            break;
          case 10:
            if ((uVar5 & 1) == 0) {
              local_2140 = (undefined1  [8])&local_2548;
              local_1124 = 0;
              local_25d8.input = (istream *)&local_2348;
              ClownLZSS::Internal::Saxman::Decompress<std::ifstream,std::ofstream&>
                        ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_25d8,(DecompressorOutput<std::basic_ofstream<char>_&> *)local_2140);
            }
            else {
              local_2140 = (undefined1  [8])&local_2548;
              local_1124 = 0;
              local_25d8.input = (istream *)&local_2348;
              ClownLZSS::Internal::
              ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,4096u,18u,_1>>
                        ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_25d8,
                         (DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,__1>
                          *)local_2140,
                         ClownLZSS::Internal::Saxman::Decompress<std::ifstream,std::ofstream&>,2);
            }
            break;
          case 0xb:
            if ((uVar5 & 1) == 0) {
              compressed_length = std::filesystem::file_size(&local_2598);
              local_2140 = (undefined1  [8])&local_2548;
              local_1124 = 0;
              local_25d8.input = (istream *)&local_2348;
              ClownLZSS::Internal::Saxman::Decompress<std::ifstream,std::ofstream&>
                        ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_25d8,(DecompressorOutput<std::basic_ofstream<char>_&> *)local_2140,
                         compressed_length);
            }
            else {
              local_2140 = (undefined1  [8])&local_2548;
              local_1124 = 0;
              local_25d8.input = (istream *)&local_2348;
              ClownLZSS::Internal::
              ModuledDecompressionWrapper<2u,(ClownLZSS::Internal::Endian)0,std::ifstream,ClownLZSS::DecompressorOutput<std::ofstream&,4096u,18u,_1>>
                        ((DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                         &local_25d8,
                         (DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,__1>
                          *)local_2140,
                         ClownLZSS::Internal::Saxman::Decompress<std::ifstream,std::ofstream&>,2);
            }
          }
          std::ifstream::~ifstream(&local_2348);
        }
        local_2548 = _VTT;
        *(undefined8 *)(local_2540 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
        std::filebuf::~filebuf(local_2540);
        std::ios_base::~ios_base(local_2450);
        iVar7 = iVar3;
        goto LAB_001038db;
      }
      lVar6 = 0x1c;
      pcVar8 = "Error: Format not specified\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,lVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Clownacy\'s LZSS compression tool\n\nUsage: clownlzss [options] [in-filename] [out-filename]\nOptions:\n\n Format:\n  -ch    Chameleon\n  -c     Comper\n  -e     Enigma\n  -f     Faxman\n  -g     GBA BIOS\n  -gv    GBA BIOS (VRAM safe)\n  -k     Kosinski\n  -kp    Kosinski+\n  -ra    Rage\n  -r     Rocket\n  -s     Saxman\n  -sn    Saxman (with no header)\n\n Misc:\n  -m[=MODULE_SIZE]  Compresses into modules\n                    MODULE_SIZE controls the module size (defaults to 0x1000)\n  -d     Decompress\n"
               ,0x1ea);
  }
LAB_001038db:
  std::filesystem::__cxx11::path::~path(&local_2570);
  std::filesystem::__cxx11::path::~path(&local_2598);
  return iVar7;
}

Assistant:

int main(int argc, char **argv)
{
	int exit_code = EXIT_SUCCESS;

	const Mode *mode = NULL;
	std::filesystem::path in_filename;
	std::filesystem::path out_filename;
	bool moduled = false, decompress = false;
	std::size_t module_size = 0x1000;

	/* Skip past the executable name */
	--argc;
	++argv;

	/* Parse arguments */
	for (int i = 0; i < argc; ++i)
	{
		const std::string_view arg(argv[i]);

		if (arg[0] == '-')
		{
			if (arg == "-h" || arg == "--help")
			{
				PrintUsage();
			}
			else if (arg[1] == 'm')
			{
				moduled = true;

				const auto argument_position = arg.find_first_of('=');

				if (argument_position != arg.npos)
				{
					char *end;
					unsigned long result = std::strtoul(&argv[i][argument_position + 1], &end, 0);

					if (*end != '\0')
					{
						std::cerr << "Invalid parameter to -m\n";
						exit_code = EXIT_FAILURE;
						break;
					}
					else
					{
						module_size = result;

						if (module_size > 0x1000)
							std::cerr << "Warning: the moduled format header does not fully support sizes greater than\n 0x1000 - header will likely be invalid!\n";
					}
				}
			}
			else if (arg == "-d")
			{
				decompress = true;
			}
			else
			{
				for (const auto &current_mode : modes)
				{
					if (arg == current_mode.command)
					{
						mode = &current_mode;
						break;
					}
				}
			}
		}
		else
		{
			if (in_filename.empty())
				in_filename = arg;
			else
				out_filename = arg;
		}
	}

	if (exit_code != EXIT_FAILURE)
	{
		if (in_filename.empty())
		{
			exit_code = EXIT_FAILURE;
			std::cerr << "Error: Input file not specified\n";
			PrintUsage();
		}
		else if (mode == NULL)
		{
			exit_code = EXIT_FAILURE;
			std::cerr << "Error: Format not specified\n";
			PrintUsage();
		}
		else
		{
			if (out_filename.empty())
				out_filename = moduled ? mode->moduled_default_filename : mode->normal_default_filename;

			try
			{
				std::ofstream out_file;
				out_file.exceptions(out_file.badbit | out_file.eofbit | out_file.failbit);
				out_file.open(out_filename, decompress ? out_file.trunc | out_file.in | out_file.out | out_file.binary : out_file.out | out_file.binary);

				if (decompress)
				{
					std::ifstream in_file;
					in_file.exceptions(in_file.badbit | in_file.eofbit | in_file.failbit);
					in_file.open(in_filename, in_file.in | in_file.binary);

					switch (mode->format)
					{
						case Format::CHAMELEON:
							if (moduled)
								ClownLZSS::ModuledChameleonDecompress(in_file, out_file);
							else
								ClownLZSS::ChameleonDecompress(in_file, out_file);
							break;

						case Format::COMPER:
							if (moduled)
								ClownLZSS::ModuledComperDecompress(in_file, out_file);
							else
								ClownLZSS::ComperDecompress(in_file, out_file);
							break;

						case Format::ENIGMA:
							if (moduled)
								ClownLZSS::ModuledEnigmaDecompress(in_file, out_file);
							else
								ClownLZSS::EnigmaDecompress(in_file, out_file);
							break;

						case Format::FAXMAN:
							if (moduled)
								ClownLZSS::ModuledFaxmanDecompress(in_file, out_file);
							else
								ClownLZSS::FaxmanDecompress(in_file, out_file);
							break;

						case Format::GBA:
						case Format::GBA_VRAM_SAFE:
							if (moduled)
								ClownLZSS::ModuledGbaDecompress(in_file, out_file);
							else
								ClownLZSS::GbaDecompress(in_file, out_file);
							break;

						case Format::KOSINSKI:
							if (moduled)
								ClownLZSS::ModuledKosinskiDecompress(in_file, out_file);
							else
								ClownLZSS::KosinskiDecompress(in_file, out_file);
							break;

						case Format::KOSINSKIPLUS:
							if (moduled)
								ClownLZSS::ModuledKosinskiPlusDecompress(in_file, out_file);
							else
								ClownLZSS::KosinskiPlusDecompress(in_file, out_file);
							break;

						case Format::RAGE:
							if (moduled)
								ClownLZSS::ModuledRageDecompress(in_file, out_file);
							else
								ClownLZSS::RageDecompress(in_file, out_file);
							break;

						case Format::ROCKET:
							if (moduled)
								ClownLZSS::ModuledRocketDecompress(in_file, out_file);
							else
								ClownLZSS::RocketDecompress(in_file, out_file);
							break;

						case Format::SAXMAN:
							if (moduled)
								ClownLZSS::ModuledSaxmanDecompress(in_file, out_file);
							else
								ClownLZSS::SaxmanDecompress(in_file, out_file);
							break;

						case Format::SAXMAN_NO_HEADER:
							if (moduled)
								ClownLZSS::ModuledSaxmanDecompress(in_file, out_file);
							else
								ClownLZSS::SaxmanDecompress(in_file, out_file, std::filesystem::file_size(in_filename));
							break;
					}
				}
				else
				{
					const bool success = [&]() -> bool
					{
						const auto file_buffer = FileToBuffer(in_filename);

						switch (mode->format)
						{
							case Format::CHAMELEON:
								if (moduled)
									return ClownLZSS::ModuledChameleonCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::ChameleonCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::COMPER:
								if (moduled)
									return ClownLZSS::ModuledComperCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::ComperCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::ENIGMA:
								if (moduled)
									return ClownLZSS::ModuledEnigmaCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::EnigmaCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::FAXMAN:
								if (moduled)
									return ClownLZSS::ModuledFaxmanCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::FaxmanCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::GBA:
								if (moduled)
									return ClownLZSS::ModuledGbaCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::GbaCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::GBA_VRAM_SAFE:
								if (moduled)
									return ClownLZSS::ModuledGbaVramSafeCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::GbaVramSafeCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::KOSINSKI:
								if (moduled)
									return ClownLZSS::ModuledKosinskiCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::KosinskiCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::KOSINSKIPLUS:
								if (moduled)
									return ClownLZSS::ModuledKosinskiPlusCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::KosinskiPlusCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::RAGE:
								if (moduled)
									return ClownLZSS::ModuledRageCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::RageCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::ROCKET:
								if (moduled)
									return ClownLZSS::ModuledRocketCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::RocketCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::SAXMAN:
								if (moduled)
									return ClownLZSS::ModuledSaxmanCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::SaxmanCompressWithHeader(file_buffer.data(), file_buffer.size(), out_file);

							case Format::SAXMAN_NO_HEADER:
								if (moduled)
									return ClownLZSS::ModuledSaxmanCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::SaxmanCompressWithoutHeader(file_buffer.data(), file_buffer.size(), out_file);
						}

						return false;
					}();

					if (!success)
					{
						exit_code = EXIT_FAILURE;
						std::cerr << "Error: File could not be compressed\n";
					}
				}
			}
			catch (const std::ios_base::failure& fail)
			{
				exit_code = EXIT_FAILURE;
				std::cerr << "Error: File IO failure with description '" << fail.what() << "'\n";
			}
		}
	}

	return exit_code;
}